

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_application_info
          (Impl *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *blob)

{
  pointer __dest;
  bool bVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  Ch *__src;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value pdf_info;
  Value app_info;
  Document doc;
  Data local_148;
  Data local_138;
  StringRefType local_128;
  StringRefType local_118;
  StringRefType local_108;
  Data local_f8 [6];
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_98;
  Stack<rapidjson::CrtAllocator> local_58;
  
  allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_f8[0].s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_f8[0].n = (Number)0x0;
  local_f8[0].s.str = (Ch *)0x3000000000000;
  alloc = rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)&local_f8[0].s);
  local_138.n = (Number)0x0;
  local_138.s.str = (Ch *)0x3000000000000;
  local_148.n = (Number)0x0;
  local_148.s.str = (Ch *)0x3000000000000;
  if (this->application_info != (VkApplicationInfo *)0x0) {
    serialize_application_info_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((Value *)&local_138.s,this->application_info,alloc);
  }
  if (this->physical_device_features != (VkPhysicalDeviceFeatures2 *)0x0) {
    bVar1 = serialize_physical_device_features_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)&local_148.s,this->physical_device_features,alloc);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_00123c25;
    }
  }
  local_108.s = "version";
  local_108.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  AddMember<Fossilize::__2>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_f8[0].s,&local_108,(anon_enum_32)alloc,allocator);
  local_118.s = "applicationInfo";
  local_118.length = 0xf;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_f8[0].s,&local_118,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_138.s,alloc);
  local_128.s = "physicalDeviceFeatures";
  local_128.length = 0x16;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_f8[0].s,&local_128,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_148.s,alloc);
  local_58.stack_ = (char *)0x0;
  local_58.stackTop_ = (char *)0x0;
  local_58.stackEnd_ = (char *)0x0;
  local_58.allocator_ = (CrtAllocator *)0x0;
  local_58.ownAllocator_ = (CrtAllocator *)0x0;
  local_58.initialCapacity_ = 0x100;
  local_98.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_98.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_98.level_stack_.stackEnd_ = (char *)0x0;
  local_98.level_stack_.stack_ = (char *)0x0;
  local_98.level_stack_.stackTop_ = (char *)0x0;
  local_98.level_stack_.initialCapacity_ = 0x200;
  local_98.maxDecimalPlaces_ = 0x144;
  local_98.hasRoot_ = false;
  local_98.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_f8[0].s,&local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (blob,(long)local_58.stackTop_ - (long)local_58.stack_);
  __dest = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &local_58);
  memcpy(__dest,__src,(long)local_58.stackTop_ - (long)local_58.stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_98.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_58);
  bVar1 = true;
LAB_00123c25:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_f8[0].s);
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::serialize_application_info(vector<uint8_t> &blob) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	Value app_info(kObjectType);
	Value pdf_info(kObjectType);
	if (application_info)
		serialize_application_info_inline(app_info, *application_info, alloc);
	if (physical_device_features)
		if (!serialize_physical_device_features_inline(pdf_info, *physical_device_features, alloc))
			return false;

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);
	doc.AddMember("applicationInfo", app_info, alloc);
	doc.AddMember("physicalDeviceFeatures", pdf_info, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize());
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	return true;
}